

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.h
# Opt level: O2

Literal __thiscall Clasp::Solver::defaultLit(Solver *this,Var v)

{
  uint uVar1;
  uint32 uVar2;
  double dVar3;
  
  switch(SUB84(this->strategy_,4) >> 0x15 & 3) {
  case 0:
    if (v < (this->shared_->varInfo_).ebo_.size) {
      uVar1 = ~(uint)(this->shared_->varInfo_).ebo_.buf[v].rep >> 2 & 2;
    }
    else {
      uVar1 = 2;
    }
    uVar2 = uVar1 + v * 4;
    break;
  case 1:
    uVar2 = v << 2;
    break;
  case 2:
    uVar2 = v * 4 + 2;
    break;
  case 3:
    dVar3 = RNG::drand(&this->rng);
    uVar2 = v * 4 + (uint)(dVar3 < 0.5) * 2;
  }
  return (Literal)uVar2;
}

Assistant:

inline Literal Solver::defaultLit(Var v) const {
	switch(strategy_.signDef) {
		default: //
		case SolverStrategies::sign_atom: return Literal(v, !varInfo(v).has(VarInfo::Body));
		case SolverStrategies::sign_pos : return posLit(v);
		case SolverStrategies::sign_neg : return negLit(v);
		case SolverStrategies::sign_rnd : return Literal(v, rng.drand() < 0.5);
	}
}